

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# columnref_expression.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnRefExpression::ColumnRefExpression
          (ColumnRefExpression *this,string *column_name,string *table_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type *psVar4;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  pointer local_38;
  pointer pbStack_30;
  pointer local_28;
  
  sVar2 = table_name->_M_string_length;
  if (sVar2 == 0) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(column_name->_M_dataplus)._M_p;
    paVar1 = &column_name->field_2;
    if (paVar3 == paVar1) {
      local_78.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_78.field_2._8_8_ = *(undefined8 *)((long)&column_name->field_2 + 8);
    }
    else {
      local_78.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_78._M_dataplus._M_p = (pointer)paVar3;
    }
    local_78._M_string_length = column_name->_M_string_length;
    (column_name->_M_dataplus)._M_p = (pointer)paVar1;
    column_name->_M_string_length = 0;
    (column_name->field_2)._M_local_buf[0] = '\0';
    __l_00._M_len = 1;
    __l_00._M_array = &local_78;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_38,__l_00,&local_79);
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(table_name->_M_dataplus)._M_p;
    paVar1 = &table_name->field_2;
    if (paVar3 == paVar1) {
      local_78.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_78.field_2._8_8_ = *(undefined8 *)((long)&table_name->field_2 + 8);
    }
    else {
      local_78.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_78._M_dataplus._M_p = (pointer)paVar3;
    }
    local_58 = &local_48;
    (table_name->_M_dataplus)._M_p = (pointer)paVar1;
    table_name->_M_string_length = 0;
    (table_name->field_2)._M_local_buf[0] = '\0';
    psVar4 = (size_type *)(column_name->_M_dataplus)._M_p;
    paVar1 = &column_name->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4 == paVar1) {
      local_48 = paVar1->_M_allocated_capacity;
      uStack_40 = *(undefined8 *)((long)&column_name->field_2 + 8);
    }
    else {
      local_48 = paVar1->_M_allocated_capacity;
      local_58 = psVar4;
    }
    local_50 = column_name->_M_string_length;
    (column_name->_M_dataplus)._M_p = (pointer)paVar1;
    column_name->_M_string_length = 0;
    (column_name->field_2)._M_local_buf[0] = '\0';
    __l._M_len = 2;
    __l._M_array = &local_78;
    local_78._M_string_length = sVar2;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_38,__l,&local_79);
  }
  (this->super_ParsedExpression).super_BaseExpression.type = COLUMN_REF;
  (this->super_ParsedExpression).super_BaseExpression.expression_class = COLUMN_REF;
  (this->super_ParsedExpression).super_BaseExpression.alias._M_dataplus._M_p =
       (pointer)&(this->super_ParsedExpression).super_BaseExpression.alias.field_2;
  (this->super_ParsedExpression).super_BaseExpression.alias._M_string_length = 0;
  (this->super_ParsedExpression).super_BaseExpression.alias.field_2._M_local_buf[0] = '\0';
  (this->super_ParsedExpression).super_BaseExpression.query_location.index = 0xffffffffffffffff;
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)&PTR__ColumnRefExpression_0244f5a0;
  (this->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_38;
  (this->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbStack_30;
  (this->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_28;
  local_28 = (pointer)0x0;
  local_38 = (pointer)0x0;
  pbStack_30 = (pointer)0x0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_38);
  if (sVar2 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  else {
    lVar5 = 0;
    do {
      if ((void *)((long)&local_48 + lVar5) != *(void **)((long)&local_58 + lVar5)) {
        operator_delete(*(void **)((long)&local_58 + lVar5));
      }
      lVar5 = lVar5 + -0x20;
    } while (lVar5 != -0x40);
  }
  return;
}

Assistant:

ColumnRefExpression::ColumnRefExpression(string column_name, string table_name)
    : ColumnRefExpression(table_name.empty() ? vector<string> {std::move(column_name)}
                                             : vector<string> {std::move(table_name), std::move(column_name)}) {
}